

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

void matchit::impl::IdUtil<std::shared_ptr<mathiu::impl::Expr_const>>::
     bindValue<std::shared_ptr<mathiu::impl::Expr_const>const&>
               (shared_ptr<const_mathiu::impl::Expr> *v,shared_ptr<const_mathiu::impl::Expr> *value)

{
  shared_ptr<const_mathiu::impl::Expr> *local_40;
  variant<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
  local_38;
  shared_ptr<const_mathiu::impl::Expr> *local_20;
  shared_ptr<const_mathiu::impl::Expr> *value_local;
  ValueVariant<std::shared_ptr<const_mathiu::impl::Expr>_> *v_local;
  
  local_40 = value;
  local_20 = value;
  value_local = v;
  std::
  variant<std::monostate,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>*,std::shared_ptr<mathiu::impl::Expr_const>const*>
  ::
  variant<std::shared_ptr<mathiu::impl::Expr_const>const*,void,void,std::shared_ptr<mathiu::impl::Expr_const>const*,void>
            ((variant<std::monostate,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>*,std::shared_ptr<mathiu::impl::Expr_const>const*>
              *)&local_38,&local_40);
  std::
  variant<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
  ::operator=((variant<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
               *)value_local,&local_38);
  std::
  variant<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
  ::~variant(&local_38);
  return;
}

Assistant:

constexpr static auto bindValue(ValueVariant<Type> &v, Value &&value,
                                                    std::true_type /* StorePointer */)
            {
                v = ValueVariant<Type>{&value};
            }